

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O1

QModelIndex * __thiscall
QAbstractProxyModel::sibling
          (QModelIndex *__return_storage_ptr__,QAbstractProxyModel *this,int row,int column,
          QModelIndex *idx)

{
  QAbstractItemModel *pQVar1;
  long in_FS_OFFSET;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (idx->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_40 = 0xffffffffffffffff;
    local_38 = 0;
    uStack_30 = 0;
  }
  else {
    (*(pQVar1->super_QObject)._vptr_QObject[0xd])(&local_40,pQVar1,idx);
  }
  (**(code **)(*(long *)this + 0x60))(__return_storage_ptr__,this,row,column,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QAbstractProxyModel::sibling(int row, int column, const QModelIndex &idx) const
{
    return index(row, column, idx.parent());
}